

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O1

quint32 __thiscall Http2::Frame::hpackBlockSize(Frame *this)

{
  FrameType FVar1;
  quint32 qVar2;
  
  FVar1 = type(this);
  qVar2 = dataSize(this);
  if (FVar1 == PUSH_PROMISE) {
    qVar2 = qVar2 - 4;
  }
  return qVar2;
}

Assistant:

quint32 Frame::hpackBlockSize() const
{
    Q_ASSERT(validatePayload() == FrameStatus::goodFrame);

    const auto frameType = type();
    Q_ASSERT(frameType == FrameType::HEADERS ||
             frameType == FrameType::PUSH_PROMISE ||
             frameType == FrameType::CONTINUATION);

    quint32 size = dataSize();
    if (frameType == FrameType::PUSH_PROMISE) {
        Q_ASSERT(size >= 4);
        size -= 4;
    }

    return size;
}